

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O0

TracedFunctions * __thiscall
wasm::TraceCalls::parseArgument
          (TracedFunctions *__return_storage_ptr__,TraceCalls *this,string *arg)

{
  string *input;
  bool bVar1;
  reference str;
  ulong uVar2;
  mapped_type *this_00;
  Name local_100;
  Name local_f0;
  undefined1 local_e0 [8];
  string traceName;
  string originName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *definition;
  iterator __end2;
  iterator __begin2;
  allocator<char> local_71;
  string local_70;
  Split local_50;
  Split *local_30;
  Split *__range2;
  string *local_20;
  string *arg_local;
  TraceCalls *this_local;
  TracedFunctions *tracedFunctions;
  
  __range2._7_1_ = 0;
  local_20 = arg;
  arg_local = (string *)this;
  this_local = (TraceCalls *)__return_storage_ptr__;
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::map(__return_storage_ptr__);
  input = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,",",&local_71);
  String::Split::Split(&local_50,input,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_30 = &local_50;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&local_30->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
  definition = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&local_30->
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&definition), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)(traceName.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_e0);
      parseFunctionName(this,str,(string *)(traceName.field_2._M_local_buf + 8),(string *)local_e0);
      wasm::Name::Name(&local_f0,(string *)local_e0);
      wasm::Name::Name(&local_100,(string *)((long)&traceName.field_2 + 8));
      this_00 = std::
                map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[](__return_storage_ptr__,&local_100);
      wasm::Name::operator=(this_00,&local_f0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)(traceName.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  String::Split::~Split(&local_50);
  return __return_storage_ptr__;
}

Assistant:

TracedFunctions parseArgument(const std::string& arg) {
    TracedFunctions tracedFunctions;

    for (const auto& definition : String::Split(arg, ",")) {
      if (definition.empty()) {
        // Empty definition, ignore.
        continue;
      }

      std::string originName, traceName;
      parseFunctionName(definition, originName, traceName);

      tracedFunctions[Name(originName)] = Name(traceName);
    }

    return tracedFunctions;
  }